

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<int,_1000> * __thiscall
TPZManVector<int,_1000>::operator=(TPZManVector<int,_1000> *this,TPZManVector<int,_1000> *copy)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<int>).fNElements;
    if (((this->super_TPZVec<int>).fNAlloc < (long)uVar1) &&
       (piVar3 = (this->super_TPZVec<int>).fStore, piVar3 != this->fExtAlloc && piVar3 != (int *)0x0
       )) {
      operator_delete__(piVar3);
      (this->super_TPZVec<int>).fStore = (int *)0x0;
      (this->super_TPZVec<int>).fNAlloc = 0;
    }
    if ((long)uVar1 < 0x3e9) {
      piVar3 = (this->super_TPZVec<int>).fStore;
      if (piVar3 != (int *)0x0 && piVar3 != this->fExtAlloc) {
        operator_delete__(piVar3);
      }
      (this->super_TPZVec<int>).fNAlloc = 0;
      (this->super_TPZVec<int>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<int>).fNAlloc < (long)uVar1) {
      piVar3 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
      (this->super_TPZVec<int>).fStore = piVar3;
      (this->super_TPZVec<int>).fNAlloc = uVar1;
    }
    (this->super_TPZVec<int>).fNElements = uVar1;
    if (0 < (long)uVar1) {
      piVar3 = (copy->super_TPZVec<int>).fStore;
      piVar2 = (this->super_TPZVec<int>).fStore;
      uVar4 = 0;
      do {
        piVar2[uVar4] = piVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}